

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RemoveSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  AActor *this;
  char *pcVar6;
  TThinkerIterator<AActor> it;
  int local_5c;
  FName local_54;
  PClassActor *local_50;
  FThinkerIterator local_48;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003efa22;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ef9f3:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003efa22:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1899,
                  "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003ef856;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003efa22;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003ef9f3;
LAB_003ef856:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003efa72:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x189a,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar2 = param[1].field_0.i == 0;
LAB_003ef8bb:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003efa91:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x189b,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_5c = param[2].field_0.i;
LAB_003ef8ce:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003ef9fc:
      pcVar6 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003efa03:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x189c,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_50 = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (local_50 != (PClassActor *)0x0) goto LAB_003ef9fc;
      local_50 = (PClassActor *)0x0;
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003efa72;
    }
    bVar2 = param[1].field_0.i == 0;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003ef8bb;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003efa91;
    }
    local_5c = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ef8ce;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (local_50 = (PClassActor *)param[3].field_0.field_1.a,
       local_50 != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar6 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003efa03;
    }
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003efa41;
      }
      goto LAB_003ef8ff;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003efa41:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x189d,
                  "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003ef8ff:
  iVar1 = param[4].field_0.i;
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&local_48,0x80);
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->master);
  if (pAVar3 != (AActor *)0x0) {
    while( true ) {
      pAVar3 = (AActor *)FThinkerIterator::Next(&local_48,false);
      if (pAVar3 == (AActor *)0x0) break;
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->master);
      pAVar5 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->master);
      if (((pAVar3 != this) && (pAVar5 == pAVar4)) && (!(bool)(bVar2 & 0 < pAVar3->health))) {
        local_54.Index = iVar1;
        DoRemove(pAVar3,local_5c,local_50,&local_54);
      }
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(removeall);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self && (mo->health <= 0 || removeall))
			{
				DoRemove(mo, flags, filter, species);
			}
		}
	}
	return 0;
}